

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atlas.c
# Opt level: O0

uint32_t chck_atlas_pop(chck_atlas *atlas)

{
  uint uVar1;
  chck_atlas_texture *local_28;
  void *tmp;
  chck_atlas_texture *t;
  chck_atlas *atlas_local;
  
  if (atlas == (chck_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/atlas/atlas.c"
                  ,0xb9,"uint32_t chck_atlas_pop(struct chck_atlas *)");
  }
  if (atlas->count == 0) {
    atlas_local._4_4_ = atlas->count;
  }
  else {
    uVar1 = atlas->count - 1;
    atlas->total_area =
         atlas->total_area - atlas->textures[uVar1].rect.w * atlas->textures[uVar1].rect.h;
    local_28 = (chck_atlas_texture *)0x0;
    if (atlas->count < 2) {
      free(atlas->textures);
    }
    else {
      local_28 = (chck_atlas_texture *)
                 chck_realloc_mul_of(atlas->textures,(ulong)(atlas->count - 1),0x1c);
      if (local_28 == (chck_atlas_texture *)0x0) {
        return atlas->count;
      }
    }
    atlas->textures = local_28;
    atlas->count = atlas->count - 1;
    atlas_local._4_4_ = atlas->count;
  }
  return atlas_local._4_4_;
}

Assistant:

uint32_t
chck_atlas_pop(struct chck_atlas *atlas)
{
   assert(atlas);

   if (atlas->count <= 0)
      return atlas->count;

   struct chck_atlas_texture *t = &atlas->textures[atlas->count - 1];
   atlas->total_area -= t->rect.w * t->rect.h;

   void *tmp = NULL;
   if (atlas->count > 1) {
      if (!(tmp = chck_realloc_mul_of(atlas->textures, (atlas->count - 1), sizeof(*atlas->textures))))
         return atlas->count;
   } else {
      free(atlas->textures);
   }

   atlas->textures = tmp;
   atlas->count -= 1;
   return atlas->count;
}